

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ww.h
# Opt level: O3

WW<127UL> * __thiscall GF2::WW<127UL>::ShLo(WW<127UL> *this,size_t shift)

{
  byte bVar1;
  ulong uVar2;
  long lVar3;
  ulong uVar4;
  long lVar5;
  
  if (0x7e < shift) {
    this->_words[0] = 0;
    this->_words[1] = 0;
    return this;
  }
  uVar2 = shift >> 6;
  if ((shift & 0x3f) == 0) {
    lVar5 = 2 - uVar2;
    lVar3 = 0;
    do {
      this->_words[lVar3] = this->_words[uVar2 + lVar3];
      lVar3 = lVar3 + 1;
    } while (lVar5 != lVar3);
  }
  else {
    if (shift < 0x40) {
      bVar1 = (byte)shift & 0x3f;
      this->_words[0] = this->_words[0] >> bVar1 | this->_words[1] << 0x40 - bVar1;
      uVar2 = 1;
    }
    uVar4 = (ulong)(shift < 0x40);
    this->_words[uVar4] = this->_words[uVar2] >> (sbyte)(shift & 0x3f);
    lVar5 = uVar4 + 1;
  }
  if ((uint)lVar5 < 2) {
    this->_words[lVar5] = 0;
  }
  return this;
}

Assistant:

WW& ShLo(size_t shift)
	{	
		if (shift < _n)
		{
			size_t wshift = shift / B_PER_W, pos;
			// величина сдвига не кратна длине слова?
			if (shift %= B_PER_W)
			{
				// сдвиг всех слов, кроме последнего
				for (pos = 0; pos + wshift + 1 < _wcount; pos++)
					_words[pos] = (_words[pos + wshift] >> shift) |
						(_words[pos + wshift + 1] << (B_PER_W - shift));
				// последнее слово
				_words[pos] = _words[pos + wshift] >> shift, ++pos;
			}
			// величина сдвига кратна длине слова
			else for (pos = 0; pos + wshift < _wcount; ++pos)
				_words[pos] = _words[pos + wshift];
			// обнуление правых слов
			for (; pos < _wcount; _words[pos++] = 0);
		}
		else 
			SetAllZero();
		return *this;
	}